

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

char * __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadSymbolicExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this)

{
  char code;
  TextReader<fmt::Locale> *this_00;
  int opcode;
  char *pcVar1;
  StringRef SVar2;
  
  while( true ) {
    this_00 = this->reader_;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    code = *pcVar1;
    if (code != 'o') {
      if (code == 'h') {
        SVar2 = TextReader<fmt::Locale>::ReadString(this_00);
        return SVar2.data_;
      }
      pcVar1 = (char *)ReadNumericExpr(this,code,false);
      return pcVar1;
    }
    opcode = ReadOpCode(this);
    if (opcode != 0x41) break;
    ReadLogicalExpr(this);
    ReadSymbolicExpr(this);
  }
  pcVar1 = (char *)ReadNumericExpr(this,opcode);
  return pcVar1;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}